

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

void doctest::detail::logTestCrashed(void)

{
  bool bVar1;
  String local_428 [3];
  Color local_409;
  char local_408 [7];
  Color col;
  char msg [1024];
  
  snprintf(local_408,0x400,"TEST CASE FAILED! (threw exception)\n\n");
  do {
    if (local_408[0] != '\0') {
      Color::Color(&local_409,Red);
      printf("%s",local_408);
      Color::~Color(&local_409);
    }
    bVar1 = always_false();
  } while (bVar1);
  String::String(local_428,local_408);
  printToDebugConsole(local_428);
  String::~String(local_428);
  return;
}

Assistant:

void logTestCrashed() {
        char msg[DOCTEST_SNPRINTF_BUFFER_LENGTH];

        DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), "TEST CASE FAILED! (threw exception)\n\n");

        DOCTEST_PRINTF_COLORED(msg, Color::Red);

        printToDebugConsole(String(msg));
    }